

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseBlanketJSCoverage.cxx
# Opt level: O3

bool __thiscall
cmParseBlanketJSCoverage::LoadCoverageData
          (cmParseBlanketJSCoverage *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *files)

{
  cmCTest *pcVar1;
  pointer pbVar2;
  ostream *poVar3;
  pointer file;
  ostringstream cmCTestLog_msg;
  long *local_1c8;
  long local_1b8 [2];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Found ",6);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," Files",6);
  std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  pcVar1 = this->CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar1,5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmParseBlanketJSCoverage.cxx"
               ,0x77,(char *)local_1c8,this->Coverage->Quiet);
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8,local_1b8[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  file = (files->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (files->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (file != pbVar2) {
    do {
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Reading JSON File ",0x12);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(file->_M_dataplus)._M_p,file->_M_string_length);
      std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      pcVar1 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar1,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmParseBlanketJSCoverage.cxx"
                   ,0x7b,(char *)local_1c8,this->Coverage->Quiet);
      if (local_1c8 != local_1b8) {
        operator_delete(local_1c8,local_1b8[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      std::ios_base::~ios_base(local_138);
      ReadJSONFile(this,file);
      file = file + 1;
    } while (file != pbVar2);
  }
  return true;
}

Assistant:

bool cmParseBlanketJSCoverage::LoadCoverageData(
  std::vector<std::string> const& files)
{
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     "Found " << files.size() << " Files" << std::endl,
                     this->Coverage.Quiet);
  for (std::string const& file : files) {
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       "Reading JSON File " << file << std::endl,
                       this->Coverage.Quiet);

    if (!this->ReadJSONFile(file)) {
      return false;
    }
  }
  return true;
}